

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilePOSIX.cpp
# Opt level: O1

void __thiscall adios2::transport::FilePOSIX::WaitForOpen(FilePOSIX *this)

{
  int iVar1;
  long *plVar2;
  size_type *psVar3;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (this->m_IsOpening == true) {
    if ((this->m_OpenFuture).super___basic_future<int>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      iVar1 = std::future<int>::get(&this->m_OpenFuture);
      this->m_FileDescriptor = iVar1;
    }
    this->m_IsOpening = false;
    std::operator+(&local_30,"couldn\'t open file ",&(this->super_Transport).m_Name);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_30);
    psVar3 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_50.field_2._M_allocated_capacity = *psVar3;
      local_50.field_2._8_8_ = plVar2[3];
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50.field_2._M_allocated_capacity = *psVar3;
      local_50._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_50._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    CheckFile(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    (this->super_Transport).m_IsOpen = true;
  }
  return;
}

Assistant:

void FilePOSIX::WaitForOpen()
{
    if (m_IsOpening)
    {
        if (m_OpenFuture.valid())
        {
            m_FileDescriptor = m_OpenFuture.get();
        }
        m_IsOpening = false;
        CheckFile("couldn't open file " + m_Name + ", in call to POSIX open");
        m_IsOpen = true;
    }
}